

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionJITTimeInfo.cpp
# Opt level: O2

void FunctionJITTimeInfo::BuildJITTimeData
               (ArenaAllocator *alloc,FunctionCodeGenJitTimeData *codeGenData,
               FunctionCodeGenRuntimeData *runtimeData,FunctionJITTimeDataIDL *jitData,
               bool isInlinee,bool isForegroundJIT)

{
  ushort uVar1;
  WriteBarrierPtr<ObjTypeSpecFldInfo> *pWVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined4 *puVar7;
  FunctionInfo *pFVar8;
  FunctionBody *pFVar9;
  ByteBlock *pBVar10;
  ParseableFunctionInfo *this;
  FunctionBodyDataIDL *pFVar11;
  ProfileDataIDL *data;
  DynamicProfileInfo *profileInfo;
  ProxyEntryPointInfo *pPVar12;
  FunctionJITTimeDataIDL **ppFVar13;
  uchar *puVar14;
  FunctionCodeGenJitTimeData *pFVar15;
  FunctionCodeGenRuntimeData *pFVar16;
  FunctionJITTimeDataIDL *pFVar17;
  FunctionJITRuntimeIDL *pFVar18;
  InlineCachePointerArray<Js::InlineCache> *pIVar19;
  long *plVar20;
  InlineCache *pIVar21;
  ulong count;
  uint j;
  ProfileId i;
  ProfileId PVar22;
  ulong uVar23;
  InlineCacheIndex i_3;
  InlineCacheIndex inlineCacheIndex;
  FunctionCodeGenRuntimeData *local_50;
  
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while( true ) {
    pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(codeGenData);
    jitData->functionInfoAddr = (long)pFVar8;
    pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(codeGenData);
    jitData->localFuncId = pFVar8->functionId;
    jitData->isAggressiveInliningEnabled = codeGenData->isAggressiveInliningEnabled;
    jitData->isInlined = codeGenData->isInlined;
    jitData->weakFuncRef = (long)(codeGenData->weakFuncRef).ptr;
    jitData->inlineesBv = (BVFixedIDL *)(codeGenData->inlineesBv).ptr;
    jitData->entryPointInfoAddr = (long)(codeGenData->entryPointInfo).ptr;
    pFVar9 = Js::FunctionCodeGenJitTimeData::GetFunctionBody(codeGenData);
    if (pFVar9 == (FunctionBody *)0x0) break;
    pFVar9 = Js::FunctionCodeGenJitTimeData::GetFunctionBody(codeGenData);
    pBVar10 = Js::FunctionBody::GetByteCode(pFVar9);
    if (pBVar10 == (ByteBlock *)0x0) break;
    pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(codeGenData);
    this = Js::FunctionInfo::GetParseableFunctionInfo(pFVar8);
    pFVar9 = Js::FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
    pFVar11 = (FunctionBodyDataIDL *)new<Memory::ArenaAllocator>(0x1b8,alloc,0x35b3c0);
    jitData->bodyData = pFVar11;
    JITTimeFunctionBody::InitializeJITFunctionData(alloc,pFVar9,pFVar11);
    if ((runtimeData != (FunctionCodeGenRuntimeData *)0x0) != (bool)(isInlinee & 1U)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                         ,0x2b,"(isInlinee == !!runtimeData)","isInlinee == !!runtimeData");
      if (!bVar4) goto LAB_00415b9a;
      *puVar7 = 0;
    }
    if (runtimeData == (FunctionCodeGenRuntimeData *)0x0) {
      local_50 = (FunctionCodeGenRuntimeData *)0x0;
    }
    else {
      pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(codeGenData);
      pFVar9 = Js::FunctionInfo::GetFunctionBody(pFVar8);
      local_50 = Js::FunctionCodeGenRuntimeData::GetForTarget(runtimeData,pFVar9);
    }
    pFVar9 = Js::FunctionCodeGenJitTimeData::GetFunctionBody(codeGenData);
    if ((pFVar9->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
      data = (ProfileDataIDL *)new<Memory::ArenaAllocator>(0xb0,alloc,0x35916e);
      profileInfo = Js::FunctionBody::GetAnyDynamicProfileInfo(pFVar9);
      JITTimeProfileInfo::InitializeJITProfileData(alloc,profileInfo,pFVar9,data,isForegroundJIT);
      jitData->bodyData->profileData = data;
      if ((isInlinee & 1U) != 0) {
        pPVar12 = Js::FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)pFVar9);
        iVar5 = (*(pPVar12->super_ExpirableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[8])(pPVar12);
        if ((char)iVar5 == '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                             ,0x3f,"(defaultEntryPointInfo->IsFunctionEntryPointInfo())",
                             "defaultEntryPointInfo->IsFunctionEntryPointInfo()");
          if (!bVar4) goto LAB_00415b9a;
          *puVar7 = 0;
        }
        jitData->callsCountAddress =
             (long)((long)&pPVar12[5].super_ExpirableObject.super_FinalizableObject.
                           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4);
        jitData->sharedPropertyGuards = (codeGenData->sharedPropertyGuards).ptr;
        jitData->sharedPropGuardCount = codeGenData->sharedPropertyGuardCount;
      }
    }
    uVar1 = jitData->bodyData->profiledCallSiteCount;
    if (uVar1 != 0) {
      jitData->inlineeCount = (uint)uVar1;
      ppFVar13 = Memory::AllocateArray<Memory::ArenaAllocator,FunctionJITTimeDataIDL*,false>
                           ((Memory *)alloc,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                            (ulong)(uint)uVar1);
      jitData->inlinees = ppFVar13;
      puVar14 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_char,false>
                          ((Memory *)alloc,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                           (ulong)jitData->bodyData->profiledCallSiteCount);
      jitData->inlineesRecursionFlags = puVar14;
      for (uVar23 = 0; count = (ulong)jitData->bodyData->profiledCallSiteCount, uVar23 < count;
          uVar23 = uVar23 + 1) {
        PVar22 = (ProfileId)uVar23;
        pFVar15 = Js::FunctionCodeGenJitTimeData::GetInlinee(codeGenData,PVar22);
        if (pFVar15 == codeGenData) {
          jitData->inlineesRecursionFlags[uVar23] = '\x01';
        }
        else if (pFVar15 != (FunctionCodeGenJitTimeData *)0x0) {
          pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(pFVar15);
          if ((pFVar8->functionBodyImpl).ptr == (FunctionProxy *)0x0) {
            pFVar16 = (FunctionCodeGenRuntimeData *)0x0;
          }
          else if ((isInlinee & 1U) == 0) {
            pFVar16 = Js::FunctionBody::GetInlineeCodeGenRuntimeData(pFVar9,PVar22);
          }
          else {
            pFVar16 = Js::FunctionCodeGenRuntimeData::GetInlinee(local_50,PVar22);
          }
          pFVar17 = (FunctionJITTimeDataIDL *)new<Memory::ArenaAllocator>(0xa8,alloc,0x35b3c0);
          jitData->inlinees[uVar23] = pFVar17;
          BuildJITTimeData(alloc,pFVar15,pFVar16,jitData->inlinees[uVar23],true,isForegroundJIT);
        }
      }
      ppFVar13 = Memory::AllocateArray<Memory::ArenaAllocator,FunctionJITTimeDataIDL*,false>
                           ((Memory *)alloc,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                            count);
      jitData->callbackInlinees = ppFVar13;
      for (uVar23 = 0; uVar23 < jitData->bodyData->profiledCallSiteCount; uVar23 = uVar23 + 1) {
        PVar22 = (ProfileId)uVar23;
        pFVar15 = Js::FunctionCodeGenJitTimeData::GetCallbackInlinee(codeGenData,PVar22);
        if (pFVar15 != (FunctionCodeGenJitTimeData *)0x0) {
          pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(pFVar15);
          if ((pFVar8->functionBodyImpl).ptr == (FunctionProxy *)0x0) {
            pFVar16 = (FunctionCodeGenRuntimeData *)0x0;
          }
          else if ((isInlinee & 1U) == 0) {
            pFVar16 = Js::FunctionBody::GetCallbackInlineeCodeGenRuntimeData(pFVar9,PVar22);
          }
          else {
            pFVar16 = Js::FunctionCodeGenRuntimeData::GetCallbackInlinee(local_50,PVar22);
          }
          pFVar17 = (FunctionJITTimeDataIDL *)new<Memory::ArenaAllocator>(0xa8,alloc,0x35b3c0);
          jitData->callbackInlinees[uVar23] = pFVar17;
          BuildJITTimeData(alloc,pFVar15,pFVar16,jitData->callbackInlinees[uVar23],true,
                           isForegroundJIT);
        }
      }
      uVar1 = jitData->bodyData->profiledCallApplyCallSiteCount;
      jitData->callApplyTargetInlineeCount = (uint)uVar1;
      if (uVar1 != 0) {
        ppFVar13 = Memory::AllocateArray<Memory::ArenaAllocator,FunctionJITTimeDataIDL*,false>
                             ((Memory *)alloc,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                              (ulong)uVar1);
        jitData->callApplyTargetInlinees = ppFVar13;
      }
      for (uVar23 = 0; uVar23 < jitData->bodyData->profiledCallApplyCallSiteCount;
          uVar23 = uVar23 + 1) {
        PVar22 = (ProfileId)uVar23;
        pFVar15 = Js::FunctionCodeGenJitTimeData::GetCallApplyTargetInlinee(codeGenData,PVar22);
        if (pFVar15 != (FunctionCodeGenJitTimeData *)0x0) {
          pFVar8 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(pFVar15);
          if ((pFVar8->functionBodyImpl).ptr == (FunctionProxy *)0x0) {
            pFVar16 = (FunctionCodeGenRuntimeData *)0x0;
          }
          else if ((isInlinee & 1U) == 0) {
            pFVar16 = Js::FunctionBody::GetCallApplyTargetInlineeCodeGenRuntimeData(pFVar9,PVar22);
          }
          else {
            pFVar16 = Js::FunctionCodeGenRuntimeData::GetCallApplyTargetInlinee(local_50,PVar22);
          }
          pFVar17 = (FunctionJITTimeDataIDL *)new<Memory::ArenaAllocator>(0xa8,alloc,0x35b3c0);
          jitData->callApplyTargetInlinees[uVar23] = pFVar17;
          BuildJITTimeData(alloc,pFVar15,pFVar16,jitData->callApplyTargetInlinees[uVar23],true,
                           isForegroundJIT);
        }
      }
    }
    pFVar18 = (FunctionJITRuntimeIDL *)new<Memory::ArenaAllocator>(0x10,alloc,0x35b3c0);
    jitData->profiledRuntimeData = pFVar18;
    if ((isInlinee & 1U) == 0) {
      pFVar11 = jitData->bodyData;
    }
    else {
      pIVar19 = Js::FunctionCodeGenRuntimeData::ClonedInlineCaches(local_50);
      pFVar11 = jitData->bodyData;
      if ((pIVar19->inlineCaches).ptr != (WriteBarrierPtr<Js::InlineCache> *)0x0) {
        uVar6 = pFVar11->inlineCacheCount;
        jitData->profiledRuntimeData->clonedCacheCount = uVar6;
        plVar20 = Memory::AllocateArray<Memory::ArenaAllocator,long,false>
                            ((Memory *)alloc,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                             (ulong)uVar6);
        jitData->profiledRuntimeData->clonedInlineCaches = plVar20;
        for (uVar23 = 0; pFVar11 = jitData->bodyData, uVar23 < pFVar11->inlineCacheCount;
            uVar23 = uVar23 + 1) {
          pIVar19 = Js::FunctionCodeGenRuntimeData::ClonedInlineCaches(local_50);
          pIVar21 = Js::InlineCachePointerArray<Js::InlineCache>::GetInlineCache
                              (pIVar19,(uint)uVar23);
          jitData->profiledRuntimeData->clonedInlineCaches[uVar23] = (long)pIVar21;
        }
      }
    }
    uVar6 = pFVar11->inlineCacheCount;
    if ((ulong)uVar6 != 0) {
      jitData->ldFldInlineeCount = uVar6;
      ppFVar13 = Memory::AllocateArray<Memory::ArenaAllocator,FunctionJITTimeDataIDL*,false>
                           ((Memory *)alloc,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                            (ulong)uVar6);
      jitData->ldFldInlinees = ppFVar13;
      pWVar2 = (codeGenData->objTypeSpecFldInfoArray).infoArray.ptr;
      if (pWVar2 != (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) {
        jitData->objTypeSpecFldInfoCount = jitData->bodyData->inlineCacheCount;
        jitData->objTypeSpecFldInfoArray = (ObjTypeSpecFldIDL **)pWVar2;
      }
      for (uVar23 = 0; uVar23 < jitData->bodyData->inlineCacheCount; uVar23 = uVar23 + 1) {
        inlineCacheIndex = (InlineCacheIndex)uVar23;
        pFVar15 = Js::FunctionCodeGenJitTimeData::GetLdFldInlinee(codeGenData,inlineCacheIndex);
        if ((isInlinee & 1U) == 0) {
          pFVar16 = Js::FunctionBody::GetLdFldInlineeCodeGenRuntimeData(pFVar9,inlineCacheIndex);
        }
        else {
          pFVar16 = Js::FunctionCodeGenRuntimeData::GetLdFldInlinee(local_50,inlineCacheIndex);
        }
        if (pFVar15 != (FunctionCodeGenJitTimeData *)0x0) {
          pFVar17 = (FunctionJITTimeDataIDL *)new<Memory::ArenaAllocator>(0xa8,alloc,0x35b3c0);
          jitData->ldFldInlinees[uVar23] = pFVar17;
          BuildJITTimeData(alloc,pFVar15,pFVar16,jitData->ldFldInlinees[uVar23],true,isForegroundJIT
                          );
        }
      }
    }
    if ((isInlinee & 1U) == 0) {
      uVar6 = codeGenData->globalObjTypeSpecFldInfoCount;
      if (uVar6 != 0) {
        pWVar2 = (codeGenData->globalObjTypeSpecFldInfoArray).ptr;
        if (pWVar2 == (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                             ,0xa9,"(globObjTypeSpecInfo != nullptr)",
                             "globObjTypeSpecInfo != nullptr");
          if (!bVar4) goto LAB_00415b9a;
          *puVar7 = 0;
          uVar6 = codeGenData->globalObjTypeSpecFldInfoCount;
        }
        jitData->globalObjTypeSpecFldInfoCount = uVar6;
        jitData->globalObjTypeSpecFldInfoArray = (ObjTypeSpecFldIDL **)pWVar2;
      }
      codeGenData = (codeGenData->next).ptr;
      if (codeGenData == (FunctionCodeGenJitTimeData *)0x0) {
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                         ,0xb2,"(isInlinee)","isInlinee");
      if (!bVar4) goto LAB_00415b9a;
      *puVar7 = 0;
    }
    else {
      codeGenData = (codeGenData->next).ptr;
      if (codeGenData == (FunctionCodeGenJitTimeData *)0x0) {
        return;
      }
    }
    pFVar17 = (FunctionJITTimeDataIDL *)new<Memory::ArenaAllocator>(0xa8,alloc,0x35b3c0);
    jitData->next = pFVar17;
    isInlinee = true;
    jitData = pFVar17;
  }
  if ((isInlinee & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                       ,0x23,"(isInlinee)","isInlinee");
    if (!bVar4) {
LAB_00415b9a:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  return;
}

Assistant:

void
FunctionJITTimeInfo::BuildJITTimeData(
    __in ArenaAllocator * alloc,
    __in const Js::FunctionCodeGenJitTimeData * codeGenData,
    __in_opt const Js::FunctionCodeGenRuntimeData * runtimeData,
    __out FunctionJITTimeDataIDL * jitData,
    bool isInlinee,
    bool isForegroundJIT)
{
    jitData->functionInfoAddr = (intptr_t)codeGenData->GetFunctionInfo();
    jitData->localFuncId = codeGenData->GetFunctionInfo()->GetLocalFunctionId();
    jitData->isAggressiveInliningEnabled = codeGenData->GetIsAggressiveInliningEnabled();
    jitData->isInlined = codeGenData->GetIsInlined();
    jitData->weakFuncRef = (intptr_t)codeGenData->GetWeakFuncRef();
    jitData->inlineesBv = (BVFixedIDL*)(const BVFixed*)codeGenData->inlineesBv;
    jitData->entryPointInfoAddr = (intptr_t)codeGenData->GetEntryPointInfo();

    if (!codeGenData->GetFunctionBody() || !codeGenData->GetFunctionBody()->GetByteCode())
    {
        // outermost function must have a body, but inlinees may not (if they are builtins)
        Assert(isInlinee);
        return;
    }

    Js::FunctionBody * body = codeGenData->GetFunctionInfo()->GetParseableFunctionInfo()->GetFunctionBody();
    jitData->bodyData = AnewStructZ(alloc, FunctionBodyDataIDL);
    JITTimeFunctionBody::InitializeJITFunctionData(alloc, body, jitData->bodyData);

    Assert(isInlinee == !!runtimeData);
    const Js::FunctionCodeGenRuntimeData * targetRuntimeData = nullptr;
    if (runtimeData)
    {
        // may be polymorphic, so seek the runtime data matching our JIT time data
        targetRuntimeData = runtimeData->GetForTarget(codeGenData->GetFunctionInfo()->GetFunctionBody());
    }
    Js::FunctionBody * functionBody = codeGenData->GetFunctionBody();
    if (functionBody->HasDynamicProfileInfo())
    {
        ProfileDataIDL * profileData = AnewStruct(alloc, ProfileDataIDL);
        JITTimeProfileInfo::InitializeJITProfileData(alloc, functionBody->GetAnyDynamicProfileInfo(), functionBody, profileData, isForegroundJIT);

        jitData->bodyData->profileData = profileData;

        if (isInlinee)
        {
            // if not inlinee, NativeCodeGenerator will provide the address
            // REVIEW: OOP JIT, for inlinees, is this actually necessary?
            Js::ProxyEntryPointInfo *defaultEntryPointInfo = functionBody->GetDefaultEntryPointInfo();
            Assert(defaultEntryPointInfo->IsFunctionEntryPointInfo());
            Js::FunctionEntryPointInfo *functionEntryPointInfo = static_cast<Js::FunctionEntryPointInfo*>(defaultEntryPointInfo);
            jitData->callsCountAddress = (intptr_t)&functionEntryPointInfo->callsCount;

            jitData->sharedPropertyGuards = codeGenData->sharedPropertyGuards;
            jitData->sharedPropGuardCount = codeGenData->sharedPropertyGuardCount;
        }
    }
    if (jitData->bodyData->profiledCallSiteCount > 0)
    {
        jitData->inlineeCount = jitData->bodyData->profiledCallSiteCount;
        // using arena because we can't recycler allocate (may be on background), and heap freeing this is slightly complicated
        jitData->inlinees = AnewArrayZ(alloc, FunctionJITTimeDataIDL*, jitData->bodyData->profiledCallSiteCount);
        jitData->inlineesRecursionFlags = AnewArrayZ(alloc, boolean, jitData->bodyData->profiledCallSiteCount);

        for (Js::ProfileId i = 0; i < jitData->bodyData->profiledCallSiteCount; ++i)
        {
            const Js::FunctionCodeGenJitTimeData * inlineeJITData = codeGenData->GetInlinee(i);
            if (inlineeJITData == codeGenData)
            {
                jitData->inlineesRecursionFlags[i] = TRUE;
            }
            else if (inlineeJITData != nullptr)
            {
                const Js::FunctionCodeGenRuntimeData * inlineeRuntimeData = nullptr;
                if (inlineeJITData->GetFunctionInfo()->HasBody())
                {
                    inlineeRuntimeData = isInlinee ? targetRuntimeData->GetInlinee(i) : functionBody->GetInlineeCodeGenRuntimeData(i);
                }
                jitData->inlinees[i] = AnewStructZ(alloc, FunctionJITTimeDataIDL);
                BuildJITTimeData(alloc, inlineeJITData, inlineeRuntimeData, jitData->inlinees[i], true, isForegroundJIT);
            }
        }

        jitData->callbackInlinees = AnewArrayZ(alloc, FunctionJITTimeDataIDL*, jitData->bodyData->profiledCallSiteCount);

        for (Js::ProfileId i = 0; i < jitData->bodyData->profiledCallSiteCount; ++i)
        {
            const Js::FunctionCodeGenJitTimeData * inlineeJITData = codeGenData->GetCallbackInlinee(i);
            if (inlineeJITData != nullptr)
            {
                const Js::FunctionCodeGenRuntimeData * inlineeRuntimeData = nullptr;
                if (inlineeJITData->GetFunctionInfo()->HasBody())
                {
                    inlineeRuntimeData = isInlinee ? targetRuntimeData->GetCallbackInlinee(i) : functionBody->GetCallbackInlineeCodeGenRuntimeData(i);
                }
                jitData->callbackInlinees[i] = AnewStructZ(alloc, FunctionJITTimeDataIDL);
                BuildJITTimeData(alloc, inlineeJITData, inlineeRuntimeData, jitData->callbackInlinees[i], true, isForegroundJIT);
            }
        }

        jitData->callApplyTargetInlineeCount = jitData->bodyData->profiledCallApplyCallSiteCount;
        if (jitData->bodyData->profiledCallApplyCallSiteCount > 0)
        {
            jitData->callApplyTargetInlinees = AnewArrayZ(alloc, FunctionJITTimeDataIDL*, jitData->bodyData->profiledCallApplyCallSiteCount);
        }
        for (Js::ProfileId i = 0; i < jitData->bodyData->profiledCallApplyCallSiteCount; ++i)
        {
            const Js::FunctionCodeGenJitTimeData * inlineeJITData = codeGenData->GetCallApplyTargetInlinee(i);
            if (inlineeJITData != nullptr)
            {
                const Js::FunctionCodeGenRuntimeData * inlineeRuntimeData = nullptr;
                if (inlineeJITData->GetFunctionInfo()->HasBody())
                {
                    inlineeRuntimeData = isInlinee ? targetRuntimeData->GetCallApplyTargetInlinee(i) : functionBody->GetCallApplyTargetInlineeCodeGenRuntimeData(i);
                }
                jitData->callApplyTargetInlinees[i] = AnewStructZ(alloc, FunctionJITTimeDataIDL);
                BuildJITTimeData(alloc, inlineeJITData, inlineeRuntimeData, jitData->callApplyTargetInlinees[i], true, isForegroundJIT);
            }
        }
    }
    jitData->profiledRuntimeData = AnewStructZ(alloc, FunctionJITRuntimeIDL);
    if (isInlinee && targetRuntimeData->ClonedInlineCaches()->HasInlineCaches())
    {
        jitData->profiledRuntimeData->clonedCacheCount = jitData->bodyData->inlineCacheCount;
        jitData->profiledRuntimeData->clonedInlineCaches = AnewArray(alloc, intptr_t, jitData->profiledRuntimeData->clonedCacheCount);
        for (uint j = 0; j < jitData->bodyData->inlineCacheCount; ++j)
        {
            jitData->profiledRuntimeData->clonedInlineCaches[j] = (intptr_t)targetRuntimeData->ClonedInlineCaches()->GetInlineCache(j);
        }
    }
    if (jitData->bodyData->inlineCacheCount > 0)
    {
        jitData->ldFldInlineeCount = jitData->bodyData->inlineCacheCount;
        jitData->ldFldInlinees = AnewArrayZ(alloc, FunctionJITTimeDataIDL*, jitData->bodyData->inlineCacheCount);

        Field(ObjTypeSpecFldInfo*)* objTypeSpecInfo = codeGenData->GetObjTypeSpecFldInfoArray()->GetInfoArray();
        if(objTypeSpecInfo)
        {
            jitData->objTypeSpecFldInfoCount = jitData->bodyData->inlineCacheCount;
            jitData->objTypeSpecFldInfoArray = unsafe_write_barrier_cast<ObjTypeSpecFldIDL**>(objTypeSpecInfo);
        }
        for (Js::InlineCacheIndex i = 0; i < jitData->bodyData->inlineCacheCount; ++i)
        {
            const Js::FunctionCodeGenJitTimeData * inlineeJITData = codeGenData->GetLdFldInlinee(i);
            const Js::FunctionCodeGenRuntimeData * inlineeRuntimeData = isInlinee ? targetRuntimeData->GetLdFldInlinee(i) : functionBody->GetLdFldInlineeCodeGenRuntimeData(i);
            if (inlineeJITData != nullptr)
            {
                jitData->ldFldInlinees[i] = AnewStructZ(alloc, FunctionJITTimeDataIDL);
                BuildJITTimeData(alloc, inlineeJITData, inlineeRuntimeData, jitData->ldFldInlinees[i], true, isForegroundJIT);
            }
        }
    }
    if (!isInlinee && codeGenData->GetGlobalObjTypeSpecFldInfoCount() > 0)
    {
        Field(ObjTypeSpecFldInfo*)* globObjTypeSpecInfo = codeGenData->GetGlobalObjTypeSpecFldInfoArray();
        Assert(globObjTypeSpecInfo != nullptr);

        jitData->globalObjTypeSpecFldInfoCount = codeGenData->GetGlobalObjTypeSpecFldInfoCount();
        jitData->globalObjTypeSpecFldInfoArray = unsafe_write_barrier_cast<ObjTypeSpecFldIDL**>(globObjTypeSpecInfo);
    }
    const Js::FunctionCodeGenJitTimeData * nextJITData = codeGenData->GetNext();
    if (nextJITData != nullptr)
    {
        // only inlinee should be polymorphic
        Assert(isInlinee);
        jitData->next = AnewStructZ(alloc, FunctionJITTimeDataIDL);
        BuildJITTimeData(alloc, nextJITData, runtimeData, jitData->next, true, isForegroundJIT);
    }
}